

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processor.hpp
# Opt level: O0

void __thiscall Processor::Processor(Processor *this)

{
  mapped_type *pmVar1;
  FunctionalUnit *local_268;
  FunctionalUnit *local_258;
  FunctionalUnit *local_248;
  ReservationStation *local_230;
  ReservationStation *local_218;
  ReservationStation *local_1f8;
  Register *local_1d8;
  key_type local_1d0;
  allocator<char> local_1c1;
  string local_1c0 [36];
  uint local_19c;
  key_type pRStack_198;
  int i_2;
  allocator<char> local_189;
  string local_188 [36];
  uint local_164;
  key_type pRStack_160;
  int i_1;
  allocator<char> local_151;
  string local_150 [32];
  uint local_130;
  int i;
  key_type local_120;
  char local_118 [8];
  char buffer [256];
  Processor *this_local;
  
  this->cycle = 0;
  this->jumping = false;
  std::vector<ToWriteBack,_std::allocator<ToWriteBack>_>::vector(&this->to_write_back);
  local_1d8 = this->registers;
  do {
    local_1d8->value = 0;
    local_1d8->rs = (ReservationStation *)0x0;
    local_1d8 = local_1d8 + 1;
  } while (local_1d8 != (Register *)&this->rs_names);
  std::
  map<ReservationStation_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ReservationStation_*>,_std::allocator<std::pair<ReservationStation_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->rs_names);
  local_1f8 = this->add_sub_rs;
  do {
    memset(local_1f8,0,0x30);
    local_1f8 = local_1f8 + 1;
  } while (local_1f8 != this->mul_div_rs);
  local_218 = this->mul_div_rs;
  do {
    memset(local_218,0,0x30);
    local_218 = local_218 + 1;
  } while (local_218 != this->load_rs);
  local_230 = this->load_rs;
  do {
    memset(local_230,0,0x30);
    local_230 = local_230 + 1;
  } while (local_230 != (ReservationStation *)this->add_sub_fu);
  local_248 = this->add_sub_fu;
  do {
    local_248->remaining_cycles = 0;
    local_248->dest = 0;
    local_248->result = 0;
    local_248 = local_248 + 1;
  } while (local_248 != this->mul_div_fu);
  local_258 = this->mul_div_fu;
  do {
    local_258->remaining_cycles = 0;
    local_258->dest = 0;
    local_258->result = 0;
    local_258 = local_258 + 1;
  } while (local_258 != this->load_fu);
  local_268 = this->load_fu;
  do {
    local_268->remaining_cycles = 0;
    local_268->dest = 0;
    local_268->result = 0;
    local_268 = local_268 + 1;
  } while (local_268 != (FunctionalUnit *)&this->field_0x4e4);
  local_120 = (key_type)0x0;
  pmVar1 = std::
           map<ReservationStation_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ReservationStation_*>,_std::allocator<std::pair<ReservationStation_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->rs_names,&local_120);
  std::__cxx11::string::operator=((string *)pmVar1,"null");
  for (local_130 = 0; (int)local_130 < 6; local_130 = local_130 + 1) {
    sprintf(local_118,"ADD_SUB_RS[%d]",(ulong)local_130);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_150,local_118,&local_151);
    pRStack_160 = this->add_sub_rs + (int)local_130;
    pmVar1 = std::
             map<ReservationStation_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ReservationStation_*>,_std::allocator<std::pair<ReservationStation_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->rs_names,&stack0xfffffffffffffea0);
    std::__cxx11::string::operator=((string *)pmVar1,local_150);
    std::__cxx11::string::~string(local_150);
    std::allocator<char>::~allocator(&local_151);
  }
  for (local_164 = 0; (int)local_164 < 3; local_164 = local_164 + 1) {
    sprintf(local_118,"MUL_DIV_RS[%d]",(ulong)local_164);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_188,local_118,&local_189);
    pRStack_198 = this->mul_div_rs + (int)local_164;
    pmVar1 = std::
             map<ReservationStation_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ReservationStation_*>,_std::allocator<std::pair<ReservationStation_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->rs_names,&stack0xfffffffffffffe68);
    std::__cxx11::string::operator=((string *)pmVar1,local_188);
    std::__cxx11::string::~string(local_188);
    std::allocator<char>::~allocator(&local_189);
  }
  for (local_19c = 0; (int)local_19c < 3; local_19c = local_19c + 1) {
    sprintf(local_118,"LOAD_RS[%d]",(ulong)local_19c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1c0,local_118,&local_1c1);
    local_1d0 = this->load_rs + (int)local_19c;
    pmVar1 = std::
             map<ReservationStation_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ReservationStation_*>,_std::allocator<std::pair<ReservationStation_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->rs_names,&local_1d0);
    std::__cxx11::string::operator=((string *)pmVar1,local_1c0);
    std::__cxx11::string::~string(local_1c0);
    std::allocator<char>::~allocator(&local_1c1);
  }
  return;
}

Assistant:

Processor() {
        char buffer[256];
        rs_names[nullptr] = "null";
        for (int i = 0; i < NUM_ADD_SUB_RS; ++ i)
            sprintf(buffer, "ADD_SUB_RS[%d]", i), rs_names[&add_sub_rs[i]] = std::string(buffer);
        for (int i = 0; i < NUM_MUL_DIV_RS; ++ i)
            sprintf(buffer, "MUL_DIV_RS[%d]", i), rs_names[&mul_div_rs[i]] = std::string(buffer);
        for (int i = 0; i < NUM_LOAD_RS; ++ i)
            sprintf(buffer, "LOAD_RS[%d]", i), rs_names[&load_rs[i]] = std::string(buffer);
    }